

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

void __thiscall miniros::RPCManager::RPCManager(RPCManager *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->uri_)._M_dataplus._M_p = (pointer)&(this->uri_).field_2;
  (this->uri_)._M_string_length = 0;
  (this->uri_).field_2._M_local_buf[0] = '\0';
  this->port_ = 0;
  (this->server_thread_)._M_id._M_thread = 0;
  XmlRpc::XmlRpcServer::XmlRpcServer(&this->server_);
  (this->master_retry_timeout_).super_DurationBase<miniros::WallDuration> =
       (DurationBase<miniros::WallDuration>)0x0;
  p_Var1 = &(this->added_connections_)._M_t._M_impl.super__Rb_tree_header;
  (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->clients_).
  super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clients_).
  super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clients_).
  super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clients_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->clients_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->clients_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->clients_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->clients_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->shutting_down_)._M_base._M_i = false;
  (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->removed_connections_)._M_t._M_impl.super__Rb_tree_header;
  (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->added_connections_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->added_connections_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->added_connections_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->added_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->added_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->connections_)._M_t._M_impl.super__Rb_tree_header;
  (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->removed_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->removed_connections_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->removed_connections_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->removed_connections_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->removed_connections_mutex_).super___mutex_base._M_mutex.__align = 0;
  (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->functions_)._M_t._M_impl.super__Rb_tree_header;
  (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->functions_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->functions_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->functions_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->functions_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->functions_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->functions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->unbind_requested_)._M_base._M_i = false;
  return;
}

Assistant:

RPCManager::RPCManager()
: port_(0)
, shutting_down_(false)
, unbind_requested_(false)
{
}